

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_add_read(NJDNode *node,char *str)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RSI;
  long in_RDI;
  char *c;
  
  if (in_RSI != (char *)0x0) {
    if (*(long *)(in_RDI + 0x40) == 0) {
      pcVar1 = strdup(in_RSI);
      *(char **)(in_RDI + 0x40) = pcVar1;
    }
    else {
      sVar2 = strlen(*(char **)(in_RDI + 0x40));
      sVar3 = strlen(in_RSI);
      pcVar1 = (char *)calloc(sVar2 + sVar3 + 1,1);
      strcpy(pcVar1,*(char **)(in_RDI + 0x40));
      strcat(pcVar1,in_RSI);
      free(*(void **)(in_RDI + 0x40));
      *(char **)(in_RDI + 0x40) = pcVar1;
    }
  }
  return;
}

Assistant:

void NJDNode_add_read(NJDNode * node, const char *str)
{
   char *c;

   if (str != NULL) {
      if (node->read == NULL) {
         node->read = strdup(str);
      } else {
         c = (char *) calloc(strlen(node->read) + strlen(str) + 1, sizeof(char));
         strcpy(c, node->read);
         strcat(c, str);
         free(node->read);
         node->read = c;
      }
   }
}